

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::readObject(QPDF *this,string *description,QPDFObjGen og)

{
  pointer pcVar1;
  InputSource *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  qpdf_offset_t qVar6;
  QPDFObjGen in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_09;
  StringDecrypter *decrypter_00;
  bool bVar7;
  QPDFObjectHandle QVar8;
  Token token;
  StringDecrypter decrypter;
  pair<QPDFObjectHandle,_bool> local_188;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  undefined1 local_160 [24];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  long *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long local_d8 [2];
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  StringDecrypter local_48;
  
  setLastObjectDescription((QPDF *)description,(string *)og,in_RCX);
  qVar6 = (**(code **)(**(long **)((description->_M_dataplus)._M_p + 0xb0) + 0x20))();
  StringDecrypter::StringDecrypter(&local_48,(QPDF *)description,in_RCX);
  pcVar1 = (description->_M_dataplus)._M_p;
  decrypter_00 = (StringDecrypter *)0x0;
  if (**(char **)(pcVar1 + 0x108) != '\0') {
    decrypter_00 = &local_48;
  }
  QPDFParser::parse(&local_188,*(InputSource **)(pcVar1 + 0xb0),(string *)(pcVar1 + 0xc0),
                    (Tokenizer *)(pcVar1 + 0x18),&decrypter_00->super_StringDecrypter,
                    (QPDF *)description,(bool)pcVar1[0x2d1]);
  if (local_188.second == true) {
    this_00 = *(InputSource **)((description->_M_dataplus)._M_p + 0xb0);
    qVar6 = InputSource::getLastOffset(this_00);
    local_170 = (undefined1  [8])local_160;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"empty object treated as null","");
    damagedPDF((QPDFExc *)local_c8,(QPDF *)description,this_00,qVar6,(string *)local_170);
    warn((QPDF *)description,(QPDFExc *)local_c8);
    QPDFExc::~QPDFExc((QPDFExc *)local_c8);
    paVar3 = extraout_RDX;
    if (local_170 != (undefined1  [8])local_160) {
      operator_delete((void *)local_170,local_160._0_8_ + 1);
      paVar3 = extraout_RDX_00;
    }
    local_160._0_8_ = paVar3;
    (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)
         local_188.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)
         local_188.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((Members *)
        local_188.first.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (Members *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(local_188.first.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base + 8);
        *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(local_188.first.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base + 8);
        *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      }
    }
    goto LAB_0022e99d;
  }
  pcVar1 = (description->_M_dataplus)._M_p;
  ::qpdf::Tokenizer::readToken
            ((Token *)local_170,(Tokenizer *)(pcVar1 + 0x18),*(InputSource **)(pcVar1 + 0xb0),
             (string *)(pcVar1 + 0xc0),true,0);
  bVar4 = QPDFObjectHandle::isDictionary(&local_188.first);
  if (bVar4) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stream","");
    if ((local_170._0_4_ != tt_word) ||
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._0_8_ != local_e0)) goto LAB_0022e707;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar7 = true;
    }
    else {
      iVar5 = bcmp(local_168._M_p,local_e8,local_160._0_8_);
      bVar7 = iVar5 == 0;
    }
  }
  else {
LAB_0022e707:
    bVar7 = false;
  }
  if ((bVar4) && (local_e8 != local_d8)) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if (bVar7) {
    readStream((QPDF *)description,&local_188.first,in_RCX,qVar6);
    pcVar1 = (description->_M_dataplus)._M_p;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_c8,(Tokenizer *)(pcVar1 + 0x18),*(InputSource **)(pcVar1 + 0xb0),
               (string *)(pcVar1 + 0xc0),true,0);
    local_170._0_4_ = local_c8._0_4_;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c0);
    std::__cxx11::string::operator=((string *)&local_148,(string *)local_a0._M_local_buf);
    std::__cxx11::string::operator=((string *)&local_128,(string *)local_80._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_allocated_capacity != local_70) {
      operator_delete((void *)local_80._M_allocated_capacity,local_70[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_allocated_capacity != &local_90) {
      operator_delete((void *)local_a0._M_allocated_capacity,
                      (ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,(ulong)(local_b0._M_allocated_capacity + 1));
    }
  }
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"endobj","");
  paVar3 = extraout_RDX_01;
  if ((local_170._0_4_ == tt_word) &&
     (paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_160._0_8_, (pointer)local_160._0_8_ == local_c0._M_p)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp(local_168._M_p,(void *)local_c8,local_160._0_8_);
      bVar4 = iVar5 == 0;
      local_160._0_8_ = extraout_RDX_02;
    }
  }
  else {
    local_160._0_8_ = paVar3;
    bVar4 = false;
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8 + 1);
    local_160._0_8_ = extraout_RDX_03;
  }
  if (!bVar4) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"expected endobj","");
    damagedPDF((QPDFExc *)local_c8,(QPDF *)description,&local_108);
    warn((QPDF *)description,(QPDFExc *)local_c8);
    QPDFExc::~QPDFExc((QPDFExc *)local_c8);
    local_160._0_8_ = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      local_160._0_8_ = extraout_RDX_05;
    }
  }
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_188.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_188.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((Members *)
      local_188.first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != (Members *)0x0
     ) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_188.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_188.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    local_160._0_8_ = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    local_160._0_8_ = extraout_RDX_07;
  }
  if (local_168._M_p != local_160 + 8) {
    operator_delete(local_168._M_p,local_160._8_8_ + 1);
    local_160._0_8_ = extraout_RDX_08;
  }
LAB_0022e99d:
  if ((Members *)
      local_188.first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != (Members *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    local_160._0_8_ = extraout_RDX_09;
  }
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._0_8_;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObject(std::string const& description, QPDFObjGen og)
{
    setLastObjectDescription(description, og);
    qpdf_offset_t offset = m->file->tell();

    StringDecrypter decrypter{this, og};
    StringDecrypter* decrypter_ptr = m->encp->encrypted ? &decrypter : nullptr;
    auto [object, empty] = QPDFParser::parse(
        *m->file,
        m->last_object_description,
        m->tokenizer,
        decrypter_ptr,
        *this,
        m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF(*m->file, m->file->getLastOffset(), "empty object treated as null"));
        return object;
    }
    auto token = readToken(*m->file);
    if (object.isDictionary() && token.isWord("stream")) {
        readStream(object, og, offset);
        token = readToken(*m->file);
    }
    if (!token.isWord("endobj")) {
        QTC::TC("qpdf", "QPDF err expected endobj");
        warn(damagedPDF("expected endobj"));
    }
    return object;
}